

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpFactory.cpp
# Opt level: O3

UnionOp * __thiscall xercesc_4_0::OpFactory::createUnionOp(OpFactory *this,XMLSize_t size)

{
  BaseRefVectorOf<xercesc_4_0::Op> *this_00;
  XMLSize_t XVar1;
  UnionOp *this_01;
  
  this_01 = (UnionOp *)XMemory::operator_new(0x28,this->fMemoryManager);
  UnionOp::UnionOp(this_01,O_UNION,size,this->fMemoryManager);
  this_00 = &this->fOpVector->super_BaseRefVectorOf<xercesc_4_0::Op>;
  BaseRefVectorOf<xercesc_4_0::Op>::ensureExtraCapacity(this_00,1);
  XVar1 = this_00->fCurCount;
  this_00->fElemList[XVar1] = (Op *)this_01;
  this_00->fCurCount = XVar1 + 1;
  return this_01;
}

Assistant:

UnionOp* OpFactory::createUnionOp(XMLSize_t size) {

    UnionOp* tmpOp = new (fMemoryManager) UnionOp(Op::O_UNION, size, fMemoryManager);

    fOpVector->addElement(tmpOp);
    return tmpOp;
}